

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O0

int32_t icu_63::anon_unknown_10::appendNonEmptyUnchanged
                  (UChar *dest,int32_t destIndex,int32_t destCapacity,UChar *s,int32_t length,
                  uint32_t options,Edits *edits)

{
  uint32_t options_local;
  int32_t length_local;
  UChar *s_local;
  int32_t destCapacity_local;
  int32_t destIndex_local;
  UChar *dest_local;
  
  if (edits != (Edits *)0x0) {
    Edits::addUnchanged(edits,length);
  }
  dest_local._4_4_ = destIndex;
  if ((options & 0x4000) == 0) {
    if (0x7fffffff - destIndex < length) {
      dest_local._4_4_ = -1;
    }
    else {
      if (destIndex + length <= destCapacity) {
        u_memcpy_63(dest + destIndex,s,length);
      }
      dest_local._4_4_ = destIndex + length;
    }
  }
  return dest_local._4_4_;
}

Assistant:

int32_t
appendNonEmptyUnchanged(UChar *dest, int32_t destIndex, int32_t destCapacity,
                        const UChar *s, int32_t length, uint32_t options, icu::Edits *edits) {
    if(edits!=NULL) {
        edits->addUnchanged(length);
    }
    if(options & U_OMIT_UNCHANGED_TEXT) {
        return destIndex;
    }
    if(length>(INT32_MAX-destIndex)) {
        return -1;  // integer overflow
    }
    if((destIndex+length)<=destCapacity) {
        u_memcpy(dest+destIndex, s, length);
    }
    return destIndex + length;
}